

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageBase.cpp
# Opt level: O3

vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> * __thiscall
myvk::ImageBase::GetMemoryBarriers
          (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
           *__return_storage_ptr__,ImageBase *this,
          vector<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_> *regions,
          VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask,VkImageLayout old_layout,
          VkImageLayout new_layout,uint32_t src_queue_family,uint32_t dst_queue_family)

{
  VkImageSubresourceRange *pVVar1;
  pointer pVVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  pointer pVVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  allocator_type local_31;
  
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            (__return_storage_ptr__,
             ((long)(regions->
                    super__Vector_base<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(regions->
                    super__Vector_base<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,&local_31
            );
  pVVar6 = (regions->
           super__Vector_base<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((regions->
      super__Vector_base<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_>)._M_impl
      .super__Vector_impl_data._M_finish != pVVar6) {
    uVar7 = 1;
    uVar8 = 0;
    do {
      pVVar2 = (__return_storage_ptr__->
               super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[uVar8].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
      pVVar2[uVar8].image = this->m_image;
      pVVar2[uVar8].oldLayout = old_layout;
      pVVar2[uVar8].newLayout = new_layout;
      pVVar2[uVar8].srcAccessMask = src_access_mask;
      pVVar2[uVar8].dstAccessMask = dst_access_mask;
      pVVar2[uVar8].srcQueueFamilyIndex = src_queue_family;
      pVVar2[uVar8].dstQueueFamilyIndex = dst_queue_family;
      pVVar2[uVar8].subresourceRange.layerCount = pVVar6[uVar8].layerCount;
      pVVar6 = pVVar6 + uVar8;
      uVar3 = pVVar6->baseMipLevel;
      uVar4 = pVVar6->levelCount;
      uVar5 = pVVar6->baseArrayLayer;
      pVVar1 = &pVVar2[uVar8].subresourceRange;
      pVVar1->aspectMask = pVVar6->aspectMask;
      pVVar1->baseMipLevel = uVar3;
      pVVar1->levelCount = uVar4;
      pVVar1->baseArrayLayer = uVar5;
      uVar8 = (ulong)uVar7;
      pVVar6 = (regions->
               super__Vector_base<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar9 = ((long)(regions->
                     super__Vector_base<VkImageSubresourceRange,_std::allocator<VkImageSubresourceRange>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6 >> 2) *
              -0x3333333333333333;
      uVar7 = uVar7 + 1;
    } while (uVar8 <= uVar9 && uVar9 - uVar8 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkImageMemoryBarrier> ImageBase::GetMemoryBarriers(const std::vector<VkImageSubresourceRange> &regions,
                                                               VkAccessFlags src_access_mask,
                                                               VkAccessFlags dst_access_mask, VkImageLayout old_layout,
                                                               VkImageLayout new_layout, uint32_t src_queue_family,
                                                               uint32_t dst_queue_family) const {
	std::vector<VkImageMemoryBarrier> barriers(regions.size());
	for (uint32_t i = 0; i < regions.size(); ++i) {
		VkImageMemoryBarrier &cur = barriers[i];
		cur.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
		cur.image = m_image;
		cur.oldLayout = old_layout;
		cur.newLayout = new_layout;
		cur.srcAccessMask = src_access_mask;
		cur.dstAccessMask = dst_access_mask;
		cur.srcQueueFamilyIndex = src_queue_family;
		cur.dstQueueFamilyIndex = dst_queue_family;
		cur.subresourceRange = regions[i];
	}
	return barriers;
}